

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

void __thiscall Alice::LoadDataShare(Alice *this)

{
  bool bVar1;
  pointer pvVar2;
  bool bVar3;
  undefined1 auVar4 [8];
  long local_278;
  ifstream fin;
  byte abStack_258 [488];
  Alice *local_70;
  undefined1 auStack_68 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  R;
  long temp;
  vector<long,_std::allocator<long>_> Element;
  
  std::ifstream::ifstream(&local_278,"../inputs/alice/D_A.txt",_S_in);
  auStack_68 = (undefined1  [8])0x0;
  R.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  R.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::istream::_M_extract<long>(&local_278);
  if ((abStack_258[*(long *)(local_278 + -0x18)] & 2) == 0) {
    local_70 = this;
    do {
      temp = 0;
      Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bVar1 = true;
      do {
        bVar3 = bVar1;
        if (Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_start ==
            Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&temp,
                     (iterator)
                     Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long *)&R.
                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          *Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start = (long)R.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
          Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        }
        std::istream::_M_extract<long>(&local_278);
        bVar1 = false;
      } while (bVar3);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)auStack_68,(value_type *)&temp);
      if (temp != 0) {
        operator_delete((void *)temp,
                        (long)Element.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_finish - temp);
      }
      pvVar2 = R.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this = local_70;
      auVar4 = auStack_68;
    } while ((abStack_258[*(long *)(local_278 + -0x18)] & 2) == 0);
  }
  else {
    pvVar2 = (pointer)0x0;
    auVar4 = (undefined1  [8])(pointer)0x0;
  }
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&(this->super_Party).D,auVar4,pvVar2);
  (this->super_Party).n_d =
       (int)((ulong)((long)(this->super_Party).D.
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_Party).D.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  std::ifstream::close();
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)auStack_68);
  std::ifstream::~ifstream(&local_278);
  return;
}

Assistant:

void Alice::LoadDataShare()
{
    std::ifstream fin("../inputs/alice/D_A.txt");
    std::vector<std::vector<long>> R;
    long temp;
    fin>>temp;
    while(!fin.eof())
    {
        std::vector<long> Element;
        for (int j = 0; j < 2; j++)
        {
            Element.push_back(temp);
            fin >> temp;
        }
        R.push_back(Element);
    }
    D.assign(R.begin(), R.end());
    n_d = D.size();
    fin.close();
}